

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O2

void __thiscall
Imf_2_5::FastHufDecoder::refill
          (FastHufDecoder *this,Int64 *buffer,int numBits,Int64 *bufferBack,int *bufferBackNumBits,
          uchar **currByte,int *currBitsLeft)

{
  ulong *puVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  *buffer = *buffer | *bufferBack >> (-(char)numBits & 0x3fU);
  iVar4 = *bufferBackNumBits;
  iVar5 = numBits - iVar4;
  if (iVar5 == 0 || numBits < iVar4) goto LAB_00560813;
  if (*currBitsLeft < 0x40) {
    *bufferBack = 0;
    *bufferBackNumBits = 0x40;
    iVar4 = *currBitsLeft;
    bVar3 = 0x38;
    uVar6 = 0;
    pbVar2 = *currByte;
    while( true ) {
      if (iVar4 < 1) break;
      uVar6 = uVar6 | (ulong)*pbVar2 << (bVar3 & 0x3f);
      *bufferBack = uVar6;
      *currByte = pbVar2 + 1;
      bVar3 = bVar3 - 8;
      iVar4 = iVar4 + -8;
      *currBitsLeft = iVar4;
      pbVar2 = pbVar2 + 1;
    }
    if (iVar4 < 0) {
      iVar4 = 0;
      goto LAB_005607ff;
    }
  }
  else {
    puVar1 = (ulong *)*currByte;
    uVar6 = *puVar1;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    *bufferBack = uVar6;
    *bufferBackNumBits = 0x40;
    *currByte = (uchar *)(puVar1 + 1);
    iVar4 = *currBitsLeft + -0x40;
LAB_005607ff:
    *currBitsLeft = iVar4;
  }
  *buffer = *buffer | uVar6 >> (-(char)iVar5 & 0x3fU);
  iVar4 = *bufferBackNumBits;
  numBits = iVar5;
LAB_00560813:
  *bufferBack = *bufferBack << ((byte)numBits & 0x3f);
  *bufferBackNumBits = iVar4 - numBits;
  if (iVar4 - numBits == 0) {
    *bufferBack = 0;
  }
  return;
}

Assistant:

inline void
FastHufDecoder::refill
    (Int64 &buffer,
     int numBits,                       // number of bits to refill
     Int64 &bufferBack,                 // the next 64-bits, to refill from
     int &bufferBackNumBits,            // number of bits left in bufferBack
     const unsigned char *&currByte,    // current byte in the bitstream
     int &currBitsLeft)                 // number of bits left in the bitsream
{
    // 
    // Refill bits into the bottom of buffer, from the top of bufferBack.
    // Always top up buffer to be completely full.
    //

    buffer |= bufferBack >> (64 - numBits);

    if (bufferBackNumBits < numBits)
    {
        numBits -= bufferBackNumBits;

        // 
        // Refill all of bufferBack from the bitstream. Either grab
        // a full 64-bit chunk, or whatever bytes are left. If we
        // don't have 64-bits left, pad with 0's.
        //

        if (currBitsLeft >= 64)
        {
            bufferBack        = READ64 (currByte); 
            bufferBackNumBits = 64;
            currByte         += sizeof (Int64);
            currBitsLeft     -= 8 * sizeof (Int64);

        }
        else
        {
            bufferBack        = 0;
            bufferBackNumBits = 64; 

            Int64 shift = 56;
            
            while (currBitsLeft > 0)
            {
                bufferBack |= ((Int64)(*currByte)) << shift;

                currByte++;
                shift        -= 8;
                currBitsLeft -= 8;
            }

            //
            // At this point, currBitsLeft might be negative, just because
            // we're subtracting whole bytes. To keep anyone from freaking
            // out, zero the counter.
            //

            if (currBitsLeft < 0)
                currBitsLeft = 0;
        }

        buffer |= bufferBack >> (64 - numBits);
    }
    
    bufferBack         = bufferBack << numBits;
    bufferBackNumBits -= numBits;

    // 
    // We can have cases where the previous shift of bufferBack is << 64 - 
    // in which case no shift occurs. The bit count math still works though,
    // so if we don't have any bits left, zero out bufferBack.
    //

    if (bufferBackNumBits == 0)
        bufferBack = 0;
}